

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

void Cbs_QuePush(Cbs_Que_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t **ppGVar1;
  int iVar2;
  
  if (((ulong)pObj & 1) == 0) {
    iVar2 = p->iTail;
    if (iVar2 == p->nSize) {
      p->nSize = iVar2 * 2;
      if (p->pData == (Gia_Obj_t **)0x0) {
        ppGVar1 = (Gia_Obj_t **)malloc((long)iVar2 << 4);
      }
      else {
        ppGVar1 = (Gia_Obj_t **)realloc(p->pData,(long)iVar2 << 4);
        iVar2 = p->iTail;
      }
      p->pData = ppGVar1;
    }
    else {
      ppGVar1 = p->pData;
    }
    p->iTail = iVar2 + 1;
    ppGVar1[iVar2] = pObj;
    return;
  }
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Cbs_QuePush( Cbs_Que_t * p, Gia_Obj_t * pObj )
{
    assert( !Gia_IsComplement(pObj) );
    if ( p->iTail == p->nSize )
    {
        p->nSize *= 2;
        p->pData = ABC_REALLOC( Gia_Obj_t *, p->pData, p->nSize ); 
    }
    p->pData[p->iTail++] = pObj;
}